

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.h
# Opt level: O0

void FileUtil::readMetaData
               (string *data_folder,int *user_num,int *item_num,int *train_rating_num,
               int *test_rating_num,string *train_path,string *test_path)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  ulonglong uVar4;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  undefined8 in_RDI;
  undefined4 *in_R8;
  string *in_R9;
  string *in_stack_00000008;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  par;
  string line;
  ifstream data_file;
  string meta_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc20;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 in_stack_fffffffffffffc30;
  int __base;
  char (*in_stack_fffffffffffffc38) [2];
  char *in_stack_fffffffffffffc40;
  char **__endptr;
  undefined4 in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc4c;
  int __base_00;
  token_compress_mode_type eCompress;
  is_any_ofF<char> *Pred;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffca0;
  string local_348 [56];
  string local_310 [32];
  string local_2f0 [80];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a0;
  string local_288 [48];
  istream local_258 [520];
  is_any_ofF<char> local_50;
  string *local_30;
  undefined4 *local_28;
  undefined4 *local_20;
  undefined4 *local_18;
  undefined4 *local_10;
  
  eCompress = (token_compress_mode_type)((ulong)in_RDI >> 0x20);
  Pred = &local_50;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                 in_stack_fffffffffffffc40);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_258,pcVar2,_S_in);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"cannot open ");
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  std::__cxx11::string::string(local_288);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(local_258,local_288);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x16e9a6);
  boost::algorithm::is_any_of<char[2]>(in_stack_fffffffffffffc38);
  boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,Pred,eCompress);
  boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF
            ((is_any_ofF<char> *)in_stack_fffffffffffffc20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&local_2a0,0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  uVar4 = strtoull(pcVar2,(char **)0x0,0);
  *local_10 = (int)uVar4;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&local_2a0,1);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  uVar4 = strtoull(pcVar2,(char **)0x0,0);
  *local_18 = (int)uVar4;
  std::getline<char,std::char_traits<char>,std::allocator<char>>(local_258,local_288);
  boost::algorithm::is_any_of<char[2]>(in_stack_fffffffffffffc38);
  boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,Pred,eCompress);
  boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF
            ((is_any_ofF<char> *)in_stack_fffffffffffffc20);
  __base_00 = 0;
  __endptr = (char **)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&local_2a0,0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  uVar4 = strtoull(pcVar2,__endptr,__base_00);
  *local_20 = (int)uVar4;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(__base_00,in_stack_fffffffffffffc48),(char *)__endptr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&local_2a0,1);
  std::operator+(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  psVar5 = local_2f0;
  std::__cxx11::string::operator=(local_30,psVar5);
  std::__cxx11::string::~string(psVar5);
  std::__cxx11::string::~string(local_310);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(local_258,local_288);
  boost::algorithm::is_any_of<char[2]>((char (*) [2])psVar5);
  boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,Pred,eCompress);
  boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF
            ((is_any_ofF<char> *)in_stack_fffffffffffffc20);
  __base = 0;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&local_2a0,0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  uVar4 = strtoull(pcVar2,(char **)__lhs,__base);
  *local_28 = (int)uVar4;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(__base_00,in_stack_fffffffffffffc48),(char *)__endptr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&local_2a0,1);
  std::operator+(__lhs,in_stack_fffffffffffffc20);
  psVar5 = local_348;
  std::__cxx11::string::operator=(in_stack_00000008,psVar5);
  std::__cxx11::string::~string(psVar5);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc98);
  std::ifstream::close();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(__base,in_stack_fffffffffffffc30));
  std::__cxx11::string::~string(local_288);
  std::ifstream::~ifstream(local_258);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void readMetaData(string data_folder, int &user_num, int &item_num, int &train_rating_num,
                      int &test_rating_num, string &train_path, string &test_path) {

        string meta_path = data_folder + "/meta";

        ifstream data_file(meta_path.c_str());

        if(!data_file.good()){
            cerr << "cannot open " << meta_path << endl;
            exit(1);
        }

        string line;
        std::getline(data_file, line);
        vector<string> par;
        boost::split(par, line, boost::is_any_of(" "));

        user_num = strtoull(par[0].c_str(), nullptr, 0);
        item_num = strtoull(par[1].c_str(), nullptr, 0);

        std::getline(data_file, line);
        boost::split(par, line, boost::is_any_of(" "));
        train_rating_num = strtoull(par[0].c_str(), nullptr, 0);
        train_path = data_folder + "/" + par[1];

        std::getline(data_file, line);
        boost::split(par, line, boost::is_any_of(" "));
        test_rating_num = strtoull(par[0].c_str(), nullptr, 0);
        test_path = data_folder + "/" + par[1];

        data_file.close();
    }